

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

iterator __thiscall re2::SparseArray<int>::set_existing(SparseArray<int> *this,int i,int v)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  _Var4;
  __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
  local_28;
  int local_20;
  int local_1c;
  int v_local;
  int i_local;
  SparseArray<int> *this_local;
  
  local_20 = v;
  local_1c = i;
  _v_local = this;
  DebugCheckInvariants(this);
  bVar2 = has_index(this,local_1c);
  iVar1 = local_20;
  if (!bVar2) {
    __assert_fail("has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x176,
                  "typename SparseArray<Value>::iterator re2::SparseArray<int>::set_existing(int, Value) [Value = int]"
                 );
  }
  pvVar3 = std::
           vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
           ::operator[](&this->dense_,(long)this->sparse_to_dense_[local_1c]);
  pvVar3->second = iVar1;
  DebugCheckInvariants(this);
  local_28._M_current =
       (IndexValue *)
       std::
       vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
       ::begin(&this->dense_);
  _Var4 = __gnu_cxx::
          __normal_iterator<re2::SparseArray<int>::IndexValue_*,_std::vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>_>
          ::operator+(&local_28,(long)this->sparse_to_dense_[local_1c]);
  return (iterator)_Var4._M_current;
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_existing(int i, Value v) {
  DebugCheckInvariants();
  DCHECK(has_index(i));
  dense_[sparse_to_dense_[i]].second = v;
  DebugCheckInvariants();
  return dense_.begin() + sparse_to_dense_[i];
}